

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsave.cpp
# Opt level: O2

void CVmSaveFile::reset(void)

{
  undefined8 uVar1;
  void *pvVar2;
  int enable;
  undefined8 *puVar3;
  long *plVar4;
  err_frame_t err_cur__;
  uint local_100 [2];
  undefined8 local_f8;
  void *local_f0;
  __jmp_buf_tag local_e8;
  
  CVmUndo::drop_undo(G_undo_X);
  CVmImageLoader::discard_synth_exports(G_image_loader_X);
  CVmMetaTable::forget_intrinsic_class_instances(G_meta_table_X);
  CVmObjTable::gc_full(&G_obj_table_X);
  enable = CVmObjTable::enable_gc(&G_obj_table_X,0);
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_f8 = *puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_100;
  local_100[0] = _setjmp(&local_e8);
  if (local_100[0] == 0) {
    CVmObjTable::reset_to_image(&G_obj_table_X);
    CVmImageLoader::do_dynamic_link(G_image_loader_X);
  }
  if (-1 < (short)local_100[0]) {
    local_100[0] = local_100[0] | 0x8000;
    CVmObjTable::enable_gc(&G_obj_table_X,enable);
  }
  uVar1 = local_f8;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = uVar1;
  if ((local_100[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pvVar2 = local_f0;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar4 + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_100[0] & 2) != 0) {
    free(local_f0);
  }
  CVmMetaTable::create_intrinsic_class_instances(G_meta_table_X);
  CVmObjTable::do_all_post_load_init(&G_obj_table_X);
  CVmObjTable::gc_full(&G_obj_table_X);
  CVmImageLoader::run_static_init(G_image_loader_X);
  return;
}

Assistant:

void CVmSaveFile::reset(VMG0_)
{
    /* 
     *   discard undo information, since it applies only to the current VM
     *   state and obviously is no longer relevant after we reset to the
     *   initial state 
     */
    G_undo->drop_undo(vmg0_);

    /* 
     *   discard all synthesized exports, since we want to dynamically link
     *   to the base image file state 
     */
    G_image_loader->discard_synth_exports();

    /* forget any IntrinsicClass instances we created at startup */
	G_meta_table->forget_intrinsic_class_instances(vmg0_);

	/* 
	 *   Run GC explicitly to clear dead objects, then disable GC for the
	 *   duration of the reset.  The dynamic link step can trigger object
	 *   creation, which can trigger GC if it's enabled, but there are
	 *   assumptions (in CVmObjTADS and probably elsewhere) that GC can't
	 *   happen during image loading, and reset is a kind of loading.
	 */
	G_obj_table->gc_full(vmg0_);
	int gc_was_enabled = G_obj_table->enable_gc(vmg_ FALSE);

    err_try
	{
		/* reset all objects to initial image file load state */
		G_obj_table->reset_to_image(vmg0_);

		/* 
		 *   forget the previous dynamic linking information and relink to
		 *   the image file again - this will ensure that any objects created
		 *   after load are properly re-created now 
		 */
		G_image_loader->do_dynamic_link(vmg0_);
	}